

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

double Catch::Benchmark::Detail::
       mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var1;
  double dVar2;
  
  dVar2 = 0.0;
  _Var1._M_current = first._M_current;
  if (first._M_current != last._M_current) {
    do {
      dVar2 = dVar2 + *_Var1._M_current;
      _Var1._M_current = _Var1._M_current + 1;
    } while (_Var1._M_current != last._M_current);
  }
  return dVar2 / (double)((long)last._M_current - (long)first._M_current >> 3);
}

Assistant:

double mean(Iterator first, Iterator last) {
                auto count = last - first;
                double sum = std::accumulate(first, last, 0.);
                return sum / count;
            }